

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O2

bool __thiscall OpenMD::SelectionCompiler::clausePrimitive(SelectionCompiler *this)

{
  bool bVar1;
  uint uVar2;
  Token local_48;
  Token local_30;
  
  uVar2 = tokPeek(this);
  if (uVar2 - 0x409 < 2) {
LAB_00258af6:
    tokenNext(&local_48,this);
    std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::push_back
              (&this->ltokenPostfix,&local_48);
    std::any::reset(&local_48.value);
    return true;
  }
  if (uVar2 != 1) {
    if (uVar2 == 2) {
      bVar1 = clauseIndex(this);
      return bVar1;
    }
    if (uVar2 == 0x400) {
      tokenNext(&local_30,this);
      std::any::reset(&local_30.value);
      bVar1 = clauseOr(this);
      if (!bVar1) {
        return false;
      }
      tokenNext(&local_48,this);
      std::any::reset(&local_48.value);
      if (local_48.tok == 0x401) {
        return true;
      }
      bVar1 = rightParenthesisExpected(this);
      return bVar1;
    }
    if (uVar2 != 0x407) {
      if (uVar2 == 0x140d) {
        bVar1 = clauseAlphaHull(this);
        return bVar1;
      }
      if (uVar2 != 0x140c) {
        if (uVar2 == 0x1406) {
          bVar1 = clauseWithin(this);
          return bVar1;
        }
        if ((~uVar2 & 0x1c00) == 0) {
          bVar1 = clauseComparator(this);
          return bVar1;
        }
        if ((~uVar2 & 0x4400) != 0) {
          bVar1 = unrecognizedExpressionToken(this);
          return bVar1;
        }
      }
      goto LAB_00258af6;
    }
  }
  bVar1 = clauseChemObjName(this);
  return bVar1;
}

Assistant:

bool SelectionCompiler::clausePrimitive() {
    int tok = tokPeek();
    switch (tok) {
    case Token::within:
      return clauseWithin();

    case Token::alphahull:
      return clauseAlphaHull();

    case Token::asterisk:
    case Token::identifier:
      return clauseChemObjName();

    case Token::integer:
      return clauseIndex();
    default:
      if ((tok & Token::atomproperty) == Token::atomproperty) {
        return clauseComparator();
      }
      if ((tok & Token::predefinedset) != Token::predefinedset) { break; }
      // fall into the code and below and just add the token
      [[fallthrough]];
    case Token::all:
    case Token::none:
    case Token::hull:
      return addTokenToPostfix(tokenNext());
    case Token::leftparen:
      tokenNext();
      if (!clauseOr()) { return false; }
      if (tokenNext().tok != Token::rightparen) {
        return rightParenthesisExpected();
      }
      return true;
    }
    return unrecognizedExpressionToken();
  }